

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compilers.cc
# Opt level: O2

void __thiscall
tchecker::details::
statement_compiler_t<std::back_insert_iterator<std::vector<long,_std::allocator<long>_>_>_>::visit
          (statement_compiler_t<std::back_insert_iterator<std::vector<long,_std::allocator<long>_>_>_>
           *this,typed_local_array_statement_t *stmt)

{
  uint uVar1;
  typed_var_expression_t *ptVar2;
  back_insert_iterator<std::vector<long,_std::allocator<long>_>_> *this_00;
  variable_id_t vVar3;
  ulong uVar4;
  bool bVar5;
  ulong local_30;
  
  ptVar2 = typed_local_array_statement_t::variable(stmt);
  vVar3 = ptVar2->_id;
  ptVar2 = typed_local_array_statement_t::variable(stmt);
  uVar1 = (**(code **)(*(long *)&(ptVar2->super_typed_lvalue_expression_t).super_typed_expression_t
                      + 0x38))(ptVar2);
  this_00 = &this->_bytecode_back_inserter;
  uVar4 = (ulong)uVar1;
  while (bVar5 = uVar4 != 0, uVar4 = uVar4 - 1, bVar5) {
    local_30 = 5;
    std::back_insert_iterator<std::vector<long,_std::allocator<long>_>_>::operator=
              (this_00,(value_type_conflict2 *)&local_30);
    local_30 = (ulong)vVar3;
    std::back_insert_iterator<std::vector<long,_std::allocator<long>_>_>::operator=
              (this_00,(value_type_conflict2 *)&local_30);
    local_30 = 5;
    std::back_insert_iterator<std::vector<long,_std::allocator<long>_>_>::operator=
              (this_00,(value_type_conflict2 *)&local_30);
    local_30 = 0;
    std::back_insert_iterator<std::vector<long,_std::allocator<long>_>_>::operator=
              (this_00,(value_type_conflict2 *)&local_30);
    local_30 = 0x1c;
    std::back_insert_iterator<std::vector<long,_std::allocator<long>_>_>::operator=
              (this_00,(value_type_conflict2 *)&local_30);
    vVar3 = vVar3 + 1;
  }
  return;
}

Assistant:

virtual void visit(tchecker::typed_local_array_statement_t const & stmt)
  {
    tchecker::variable_size_t id = stmt.variable().id();
    tchecker::variable_size_t asize = stmt.variable().size();

    for (tchecker::variable_size_t i = 0; i < asize; i++) {
      _bytecode_back_inserter = VM_PUSH;
      _bytecode_back_inserter = id + i;
      _bytecode_back_inserter = VM_PUSH;
      _bytecode_back_inserter = 0;
      _bytecode_back_inserter = VM_INIT_FRAME;
    }
  }